

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeArrayValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  ArrayIndex AVar4;
  undefined4 extraout_var;
  Value *root;
  long lVar5;
  ulong uVar6;
  string local_70;
  ulong local_50;
  string *local_48;
  pointer local_40;
  pointer local_38;
  
  AVar4 = Value::size(value);
  local_50 = CONCAT44(extraout_var,AVar4);
  if (AVar4 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[]","");
    pushValue(this,&local_70);
  }
  else {
    bVar3 = isMultineArray(this,value);
    if (!bVar3) {
      uVar6 = (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar6 == (local_50 & 0xffffffff)) {
        psVar1 = &this->document_;
        std::__cxx11::string::append((char *)psVar1);
        lVar5 = 0;
        do {
          if (lVar5 != 0) {
            std::__cxx11::string::append((char *)psVar1);
          }
          std::__cxx11::string::_M_append
                    ((char *)psVar1,
                     *(ulong *)((long)&(((this->childValues_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar5));
          lVar5 = lVar5 + 0x20;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        std::__cxx11::string::append((char *)psVar1);
        return;
      }
      __assert_fail("childValues_.size() == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                    ,0x17a,"void Json::StyledWriter::writeArrayValue(const Value &)");
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
    writeIndent(this);
    local_48 = &this->document_;
    std::__cxx11::string::_M_append((char *)local_48,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    indent(this);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = (ulong)((int)local_50 - 1);
    lVar5 = 8;
    uVar6 = 0;
    while( true ) {
      root = Value::operator[](value,(ArrayIndex)uVar6);
      writeCommentBeforeValue(this,root);
      if (local_38 == local_40) {
        writeIndent(this);
        writeValue(this,root);
      }
      else {
        pbVar2 = (this->childValues_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)local_48,*(ulong *)((long)pbVar2 + lVar5 + -8));
      }
      if (local_50 == uVar6) break;
      uVar6 = uVar6 + 1;
      std::__cxx11::string::push_back((char)local_48);
      writeCommentAfterValueOnSameLine(this,root);
      lVar5 = lVar5 + 0x20;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"]","");
    writeIndent(this);
    std::__cxx11::string::_M_append((char *)local_48,(ulong)local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StyledWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      document_ += "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          document_ += ", ";
        document_ += childValues_[index];
      }
      document_ += " ]";
    }
  }
}